

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

RTPTransmissionInfo * __thiscall
jrtplib::RTPUDPv6Transmitter::GetTransmissionInfo(RTPUDPv6Transmitter *this)

{
  RTPUDPv6TransmissionInfo *this_00;
  _List_base<in6_addr,_std::allocator<in6_addr>_> local_30;
  
  if (this->init == true) {
    this_00 = (RTPUDPv6TransmissionInfo *)
              operator_new(0x38,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x1c);
    std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::list
              ((list<in6_addr,_std::allocator<in6_addr>_> *)&local_30,&this->localIPs);
    RTPUDPv6TransmissionInfo::RTPUDPv6TransmissionInfo
              (this_00,(list<in6_addr,_std::allocator<in6_addr>_> *)&local_30,this->rtpsock,
               this->rtcpsock,this->portbase,this->portbase + 1);
    std::__cxx11::_List_base<in6_addr,_std::allocator<in6_addr>_>::_M_clear(&local_30);
  }
  else {
    this_00 = (RTPUDPv6TransmissionInfo *)0x0;
  }
  return &this_00->super_RTPTransmissionInfo;
}

Assistant:

RTPTransmissionInfo *RTPUDPv6Transmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPUDPv6TransmissionInfo(localIPs,rtpsock,rtcpsock,portbase,portbase+1);
	MAINMUTEX_UNLOCK
	return tinf;
}